

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O2

matrix4 * v3translationMat(vector3d *axis,matrix4 *m)

{
  m->element[0][0] = 1.0;
  m->element[0][1] = 0.0;
  m->element[0][2] = 0.0;
  m->element[0][3] = 0.0;
  m->element[1][0] = 0.0;
  m->element[1][1] = 1.0;
  m->element[1][2] = 0.0;
  m->element[1][3] = 0.0;
  m->element[2][0] = 0.0;
  m->element[2][1] = 0.0;
  m->element[2][2] = 1.0;
  m->element[2][3] = 0.0;
  m->element[3][0] = 0.0;
  m->element[3][1] = 0.0;
  m->element[3][2] = 0.0;
  m->element[3][3] = 1.0;
  m->element[3][0] = axis->x;
  m->element[3][1] = axis->y;
  m->element[3][2] = axis->z;
  return m;
}

Assistant:

matrix4*  v3translationMat(vector3d* axis, matrix4* m) {

	v3identityMat(m);

	m->element[3][0] = axis->x;
	m->element[3][1] = axis->y;
	m->element[3][2] = axis->z;

	return(m);
}